

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fct.h
# Opt level: O2

size_t fctkern__tst_cnt(fctkern_t *nk)

{
  size_t sVar1;
  fct_ts_t *ts;
  size_t sVar2;
  size_t idx;
  size_t sVar3;
  
  if (nk != (fctkern_t *)0x0) {
    sVar1 = (nk->ts_list).used_itm_num;
    sVar3 = 0;
    for (idx = 0; sVar1 != idx; idx = idx + 1) {
      ts = (fct_ts_t *)fct_nlist__at(&nk->ts_list,idx);
      sVar2 = fct_ts__tst_cnt(ts);
      sVar3 = sVar3 + sVar2;
    }
    return sVar3;
  }
  __assert_fail("nk != __null",
                "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/include/fct.h",0x8dc,
                "size_t fctkern__tst_cnt(const fctkern_t *)");
}

Assistant:

static size_t
fctkern__tst_cnt(fctkern_t const *nk)
{
    size_t tally =0;
    FCT_ASSERT( nk != NULL );
    FCT_NLIST_FOREACH_BGN(fct_ts_t *, ts, &(nk->ts_list))
    {
        tally += fct_ts__tst_cnt(ts);
    }
    FCT_NLIST_FOREACH_END();
    return tally;
}